

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::Merge
          (StatisticsAccumulation *this,int num_data,vector<double,_std::allocator<double>_> *first,
          SymmetricMatrix *second,Buffer *buffer)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  double *pdVar7;
  pointer pdVar8;
  bool bVar9;
  ulong uVar10;
  size_type __new_size;
  long lVar11;
  int i;
  uint uVar12;
  ulong uVar13;
  uint column;
  double dVar14;
  double dVar15;
  Row local_80;
  double local_68;
  vector<double,_std::allocator<double>_> *local_60;
  SymmetricMatrix *local_58;
  double local_50;
  Row local_48;
  
  bVar9 = false;
  if (((buffer != (Buffer *)0x0) && (bVar9 = false, 0 < num_data)) && (this->is_valid_ != false)) {
    __new_size = (long)this->num_order_ + 1;
    if ((this->num_statistics_order_ < 1) ||
       (((long)(first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == __new_size &&
        ((this->num_statistics_order_ == 1 || (second->num_dimension_ == (int)__new_size)))))) {
      iVar6 = buffer->zeroth_order_statistics_;
      if (iVar6 == 0) {
        buffer->zeroth_order_statistics_ = num_data;
        if ((first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::operator=
                    (&buffer->first_order_statistics_,first);
        }
        bVar9 = true;
        if (second->num_dimension_ != 0) {
          SymmetricMatrix::operator=(&buffer->second_order_statistics_,second);
        }
      }
      else {
        if (this->numerically_stable_ == true) {
          pdVar8 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar8 >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize(&buffer->delta_,__new_size);
            pdVar8 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          std::
          transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
                    ((buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,pdVar8);
          iVar6 = buffer->zeroth_order_statistics_;
        }
        pdVar8 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar14 = (double)iVar6;
        local_68 = (double)num_data + dVar14;
        buffer->zeroth_order_statistics_ = iVar6 + num_data;
        local_60 = first;
        if (second->num_dimension_ != 0) {
          if (this->numerically_stable_ == false) {
            for (uVar12 = 0; (int)uVar12 <= this->num_order_; uVar12 = uVar12 + 1) {
              column = 0;
              if (this->diagonal_ != false) {
                column = uVar12;
              }
              for (; column <= uVar12; column = column + 1) {
                local_80._vptr_Row = (_func_int **)&PTR__Row_00111d30;
                local_80.matrix_ = second;
                local_80.row_ = uVar12;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_80,column);
                dVar2 = *pdVar7;
                local_48._vptr_Row = (_func_int **)&PTR__Row_00111d30;
                local_48.matrix_ = &buffer->second_order_statistics_;
                local_48.row_ = uVar12;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_48,column);
                *pdVar7 = dVar2 + *pdVar7;
              }
            }
          }
          else {
            local_50 = ((double)num_data * dVar14) / local_68;
            local_58 = &buffer->second_order_statistics_;
            for (uVar13 = 0; (long)uVar13 <= (long)this->num_order_; uVar13 = uVar13 + 1) {
              uVar10 = uVar13 & 0xffffffff;
              if (this->diagonal_ == false) {
                uVar10 = 0;
              }
              for (; uVar10 <= uVar13; uVar10 = uVar10 + 1) {
                local_80._vptr_Row = (_func_int **)&PTR__Row_00111d30;
                local_80.matrix_ = second;
                local_80.row_ = (uint)uVar13;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_80,(int)uVar10);
                dVar2 = *pdVar7;
                dVar15 = pdVar8[uVar13] * local_50;
                dVar3 = pdVar8[uVar10];
                local_80._vptr_Row = (_func_int **)&PTR__Row_00111d30;
                local_80.matrix_ = local_58;
                local_80.row_ = (uint)uVar13;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_80,(int)uVar10);
                *pdVar7 = dVar15 * dVar3 + dVar2 + *pdVar7;
              }
            }
          }
        }
        pdVar8 = (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar9 = true;
        if (pdVar8 != pdVar4) {
          if (this->numerically_stable_ == true) {
            pdVar4 = (buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (lVar11 = 0; pdVar1 = (double *)((long)pdVar5 + lVar11), pdVar1 != pdVar7;
                lVar11 = lVar11 + 8) {
              *(double *)((long)pdVar4 + lVar11) =
                   *pdVar1 * (dVar14 / local_68) + *(double *)((long)pdVar8 + lVar11);
            }
          }
          else {
            std::
            transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                      (pdVar8,pdVar4,
                       (buffer->first_order_statistics_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
          }
        }
      }
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

bool StatisticsAccumulation::Merge(
    int num_data, const std::vector<double>& first,
    const SymmetricMatrix& second,
    StatisticsAccumulation::Buffer* buffer) const {
  if (!is_valid_ || num_data <= 0 || NULL == buffer) {
    return false;
  }

  const std::size_t length(num_order_ + 1);
  if (1 <= num_statistics_order_ && first.size() != length) {
    return false;
  }
  if (2 <= num_statistics_order_ &&
      second.GetNumDimension() != static_cast<int>(length)) {
    return false;
  }

  // Copy statistics if the buffer is empty.
  if (0 == buffer->zeroth_order_statistics_) {
    buffer->zeroth_order_statistics_ = num_data;
    if (!first.empty()) buffer->first_order_statistics_ = first;
    if (!second.Empty()) buffer->second_order_statistics_ = second;
    return true;
  }

  // Compute delta.
  if (numerically_stable_) {
    if (buffer->delta_.size() != length) {
      buffer->delta_.resize(length);
    }
    std::transform(buffer->first_order_statistics_.begin(),
                   buffer->first_order_statistics_.end(), first.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  const double m(static_cast<double>(buffer->zeroth_order_statistics_));
  const double n(static_cast<double>(num_data));
  const double mpn(m + n);
  const double mn(m * n);
  buffer->zeroth_order_statistics_ += num_data;

  // Merge 2nd order statistics.
  if (!second.Empty()) {
    if (numerically_stable_) {
      const double c(mn / mpn);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          const double term1(second[i][j]);
          const double term2(c * delta[i] * delta[j]);
          buffer->second_order_statistics_[i][j] += term1 + term2;
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += second[i][j];
        }
      }
    }
  }

  // Merge 1st order statistics.
  if (!first.empty()) {
    if (numerically_stable_) {
      const double c(m / mpn);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     first.begin(), buffer->first_order_statistics_.begin(),
                     [c](double x, double y) { return c * x + y; });
    } else {
      std::transform(
          first.begin(), first.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}